

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::lts_20250127::debugging_internal::ParseMangledName(State *state)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  iVar1 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar1 + 1;
  state->steps = iVar2 + 1;
  if (iVar2 < 0x20000 && iVar1 < 0x100) {
    bVar3 = ParseTwoCharToken(state,"_Z");
    if (bVar3) {
      bVar3 = ParseEncoding(state);
      goto LAB_002644cc;
    }
  }
  bVar3 = false;
LAB_002644cc:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar3;
}

Assistant:

static bool ParseMangledName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  return ParseTwoCharToken(state, "_Z") && ParseEncoding(state);
}